

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

string * Assimp::FBX::Util::AddTokenText
                   (string *__return_storage_ptr__,string *prefix,string *text,Token *tok)

{
  char *pcVar1;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  if (tok->column == 0xffffffff) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,(string *)prefix);
    std::operator<<((ostream *)local_1a0," (");
    pcVar1 = TokenTypeString(tok->type);
    std::operator<<((ostream *)local_1a0,pcVar1);
    std::operator<<((ostream *)local_1a0,", offset 0x");
    *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::operator<<((ostream *)local_1a0,") ");
    std::operator<<((ostream *)local_1a0,(string *)text);
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::operator<<((ostream *)local_1a0,(string *)prefix);
    std::operator<<((ostream *)local_1a0," (");
    pcVar1 = TokenTypeString(tok->type);
    std::operator<<((ostream *)local_1a0,pcVar1);
    std::operator<<((ostream *)local_1a0,", line ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::operator<<((ostream *)local_1a0,", col ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::operator<<((ostream *)local_1a0,") ");
    std::operator<<((ostream *)local_1a0,(string *)text);
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string AddTokenText(const std::string& prefix, const std::string& text, const Token* tok)
{
    if(tok->IsBinary()) {
        return static_cast<std::string>( (Formatter::format() << prefix <<
            " (" << TokenTypeString(tok->Type()) <<
            ", offset 0x" << std::hex << tok->Offset() << ") " <<
            text) );
    }

    return static_cast<std::string>( (Formatter::format() << prefix <<
        " (" << TokenTypeString(tok->Type()) <<
        ", line " << tok->Line() <<
        ", col " << tok->Column() << ") " <<
        text) );
}